

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Txa.cpp
# Opt level: O3

int processTxa(istream *in,path *output)

{
  pointer pTVar1;
  long *plVar2;
  size_type *psVar3;
  pointer pTVar4;
  undefined1 auVar5 [16];
  string outName;
  string outTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  TxaHeader header;
  Image local_1a8;
  path outFilename;
  Image local_158;
  path outputDir;
  ThreadedImageSaver saver;
  path local_80;
  path local_58;
  
  std::filesystem::__cxx11::path::parent_path();
  auVar5 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar5._8_8_ == 0 || auVar5._0_8_ == 0) {
    std::filesystem::__cxx11::path::path((path *)&saver);
  }
  else {
    std::__cxx11::string::substr((ulong)&header,auVar5._0_8_);
    std::filesystem::__cxx11::path::path((path *)&saver,(string_type *)&header,auto_format);
    if ((uint32_t *)CONCAT71(header._1_7_,header.isSwitch) != &header.indexSize) {
      operator_delete((undefined1 *)CONCAT71(header._1_7_,header.isSwitch),header._16_8_ + 1);
    }
  }
  outTemplate._M_dataplus._M_p = (pointer)&outTemplate.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&outTemplate,
             saver.threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)&((saver.threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->_M_id)._M_thread +
             (long)&((saver.threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread);
  std::filesystem::__cxx11::path::~path((path *)&saver);
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator>>(in,&header);
  ThreadedImageSaver::ThreadedImageSaver(&saver);
  pTVar1 = header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
      super__Vector_impl_data._M_start !=
      header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar4 = header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      outFilename._M_pathname._M_dataplus._M_p = (pointer)&outFilename._M_pathname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&outFilename,outTemplate._M_dataplus._M_p,
                 outTemplate._M_dataplus._M_p + outTemplate._M_string_length);
      std::__cxx11::string::append((char *)&outFilename);
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&outFilename,(ulong)(pTVar4->name)._M_dataplus._M_p);
      outName._M_dataplus._M_p = (pointer)&outName.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar3) {
        outName.field_2._M_allocated_capacity = *psVar3;
        outName.field_2._8_8_ = plVar2[3];
      }
      else {
        outName.field_2._M_allocated_capacity = *psVar3;
        outName._M_dataplus._M_p = (pointer)*plVar2;
      }
      outName._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outFilename._M_pathname._M_dataplus._M_p != &outFilename._M_pathname.field_2) {
        operator_delete(outFilename._M_pathname._M_dataplus._M_p,
                        outFilename._M_pathname.field_2._M_allocated_capacity + 1);
      }
      local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1a8.size.width = 0;
      local_1a8.size.height = 0;
      local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      processChunkNoHeader
                (&local_1a8,pTVar4->offset,pTVar4->length,header.indexed,(uint)pTVar4->width,
                 (uint)pTVar4->height,in,&outName,header.isSwitch);
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_1,outName._M_dataplus._M_p,
                 outName._M_dataplus._M_p + outName._M_string_length);
      std::__cxx11::string::append((char *)&__str_1);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_58,&__str_1,auto_format);
      std::filesystem::__cxx11::operator/(&outFilename,&outputDir,&local_58);
      std::filesystem::__cxx11::path::~path(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      local_158.size = local_1a8.size;
      local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::filesystem::__cxx11::path::path(&local_80,&outFilename);
      ThreadedImageSaver::enqueue(&saver,&local_158,&local_80);
      std::filesystem::__cxx11::path::~path(&local_80);
      if (local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::filesystem::__cxx11::path::~path(&outFilename);
      if (local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outName._M_dataplus._M_p != &outName.field_2) {
        operator_delete(outName._M_dataplus._M_p,outName.field_2._M_allocated_capacity + 1);
      }
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar1);
  }
  ThreadedImageSaver::~ThreadedImageSaver(&saver);
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::~vector(&header.chunks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outTemplate._M_dataplus._M_p != &outTemplate.field_2) {
    operator_delete(outTemplate._M_dataplus._M_p,outTemplate.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&outputDir);
  return 0;
}

Assistant:

int processTxa(std::istream &in, const fs::path &output) {
	fs::path outputDir = output.parent_path();
	std::string outTemplate = output.stem().string();

	TxaHeader header;
	in >> header;

#if ENABLE_MULTITHREADED
	ThreadedImageSaver saver;
#endif

	for (const auto& chunk : header.chunks) {
		std::string outName = outTemplate + "_" + chunk.name;
		Image currentChunk({0, 0});
		processChunkNoHeader(currentChunk, chunk.offset, chunk.length, header.indexed, chunk.width, chunk.height, in, outName, header.isSwitch);

		auto outFilename = outputDir/fs::u8path(outName + ".png");
#if ENABLE_MULTITHREADED
		saver.enqueue(std::move(currentChunk), std::move(outFilename));
#else
		currentChunk.writePNG(outFilename);
#endif
	}
	return 0;
}